

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O2

void __thiscall ByteData160_BytesConstructor_Test::TestBody(ByteData160_BytesConstructor_Test *this)

{
  byte bVar1;
  bool bVar2;
  size_t i;
  ulong uVar3;
  char *message;
  char *in_R9;
  AssertHelper AStack_98;
  string local_90;
  AssertionResult gtest_ar__1;
  AssertHelper local_60;
  ByteData160 copy_data;
  ByteData160 byte_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> target;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&target,0x14,(allocator_type *)&local_90);
  bVar1 = 1;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start); uVar3 = uVar3 + 1) {
    target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = bVar1;
    bVar1 = bVar1 + 1;
    if (9 < bVar1) {
      bVar1 = 0;
    }
  }
  cfd::core::ByteData160::ByteData160(&byte_data,&target);
  cfd::core::ByteData160::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,&byte_data);
  bVar2 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,&target
                         );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90);
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_90,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&copy_data,"byte_data.GetHex().c_str()",
             "\"0102030405060708090001020304050607080900\"",local_90._M_dataplus._M_p,
             "0102030405060708090001020304050607080900");
  std::__cxx11::string::~string((string *)&local_90);
  if ((char)copy_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (copy_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      message = "";
    }
    else {
      message = *(char **)copy_data.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x3a,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&copy_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  copy_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  copy_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)&copy_data,(AssertionResult *)"is_equals","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x3b,local_90._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    std::__cxx11::string::~string((string *)&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&copy_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&copy_data.data_,&byte_data.data_);
  gtest_ar__1.success_ = cfd::core::ByteData160::operator==(&copy_data,&byte_data);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&AStack_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)&gtest_ar__1,(AssertionResult *)"copy_data == byte_data",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x3d,local_90._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&AStack_98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&copy_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

TEST(ByteData160, BytesConstructor) {
  std::vector<uint8_t> target(20);
  uint8_t byte = 1;
  for (size_t i = 0; i < target.size(); i++) {
    target[i] = byte;
    byte++;
    if (byte > 9) {
      byte = 0;
    }
  }
  ByteData160 byte_data = ByteData160(target);
  bool is_equals = (byte_data.GetBytes() == target);

  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "0102030405060708090001020304050607080900");
  EXPECT_TRUE(is_equals);
  auto copy_data = byte_data;
  EXPECT_TRUE(copy_data == byte_data);
}